

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
::
Vector_column<std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>>>>
          (Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
           *this,Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                 *column,Index columnIndex,
          map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  bool bVar1;
  ID_index rowIndex;
  size_type __n;
  Column_support *this_00;
  reference ppEVar2;
  Entry_constructor *local_b8;
  Field_operators *local_a8;
  Entry *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Column_support *__range3;
  Index i;
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>
  local_39;
  value_type local_38;
  Entry_constructor *local_30;
  Column_settings *colSettings_local;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
  *rowContainer_local;
  Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *pVStack_18;
  Index columnIndex_local;
  Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *column_local;
  Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *this_local;
  
  local_30 = (Entry_constructor *)colSettings;
  colSettings_local = (Column_settings *)rowContainer;
  rowContainer_local._4_4_ = columnIndex;
  pVStack_18 = column;
  column_local = (Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                  *)this;
  Row_access<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::Row_access((Row_access<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                *)this,columnIndex,rowContainer);
  Column_dimension_holder<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::Column_dimension_holder
            ((Column_dimension_holder<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              *)(this + 0x10),&pVStack_18->super_Column_dimension_option);
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::Chain_column_extra_properties
            ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              *)(this + 0x14),&pVStack_18->super_Chain_column_option);
  __n = std::
        vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ::size(&pVStack_18->column_);
  local_38 = (value_type)0x0;
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>
  ::allocator(&local_39);
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ::vector((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
            *)(this + 0x20),__n,&local_38,&local_39);
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>
  ::~allocator(&local_39);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)(this + 0x38),&pVStack_18->erasedValues_);
  if (local_30 == (Entry_constructor *)0x0) {
    local_a8 = pVStack_18->operators_;
  }
  else {
    local_a8 = (Field_operators *)0x0;
  }
  *(Field_operators **)(this + 0x70) = local_a8;
  if (local_30 == (Entry_constructor *)0x0) {
    local_b8 = pVStack_18->entryPool_;
  }
  else {
    local_b8 = local_30;
  }
  *(Entry_constructor **)(this + 0x78) = local_b8;
  __range3._0_4_ = 0;
  this_00 = &pVStack_18->column_;
  __end0 = std::
           vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
           ::begin(this_00);
  entry = (Entry *)std::
                   vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                   ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>_>
                                *)&entry);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>_>
              ::operator*(&__end0);
    rowIndex = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               ::get_row_index(*ppEVar2);
    Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
    ::_update_entry((Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                     *)this,rowIndex,(Index)__range3);
    __gnu_cxx::
    __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>_>
    ::operator++(&__end0);
    __range3._0_4_ = (Index)__range3 + 1;
  }
  return;
}

Assistant:

inline Vector_column<Master_matrix>::Vector_column(const Vector_column& column,
                                                   Index columnIndex,
                                                   Row_container* rowContainer,
                                                   Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.size(), nullptr),
      erasedValues_(column.erasedValues_),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  Index i = 0;
  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _update_entry(entry->get_row_index(), i++);
    } else {
      _update_entry(entry->get_element(), entry->get_row_index(), i++);
    }
  }
}